

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.c
# Opt level: O2

void TestSuite_StringSymbol(void)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  char *__format;
  char *__format_00;
  
  sysbvm_test_currentTestCaseName = "InternWithString";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- InternWithString...");
  TuuvmCore_initialize();
  sVar2 = sysbvm_symbol_internWithString(sysbvm_test_context,2,"ABC");
  _Var1 = sysbvm_tuple_isBytes(sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:27: Assertion failure: sysbvm_tuple_isBytes(symbol)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  if (((sVar2 & 0xf) != 0 || sVar2 == 0) || (*(int *)(sVar2 + 0xc) != 2)) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:28: Obtained value is not equal to 2"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar3 = sysbvm_symbol_internWithString(sysbvm_test_context,2,"ABC");
  _Var1 = sysbvm_tuple_isBytes(sVar3);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:31: Assertion failure: sysbvm_tuple_isBytes(secondSymbol)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  if (((sVar3 & 0xf) != 0 || sVar3 == 0) || (*(int *)(sVar3 + 0xc) != 2)) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:32: Obtained value is not equal to 2"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  if (sVar2 != sVar3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:34: Obtained value is not equal to symbol"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  __format = "";
  __format_00 = "";
  if (sysbvm_test_currentHasError == 0) {
    __format_00 = " Success\n";
  }
  printf(__format_00);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "InternWithCString";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- InternWithCString...");
  TuuvmCore_initialize();
  sVar2 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Hello World\n");
  _Var1 = sysbvm_tuple_isBytes(sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:40: Assertion failure: sysbvm_tuple_isBytes(symbol)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  if (((sVar2 & 0xf) != 0 || sVar2 == 0) || (*(int *)(sVar2 + 0xc) != 0xc)) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:41: Obtained value is not equal to 12"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar3 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Hello World\n");
  _Var1 = sysbvm_tuple_isBytes(sVar3);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:44: Assertion failure: sysbvm_tuple_isBytes(secondSymbol)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  if (((sVar3 & 0xf) != 0 || sVar3 == 0) || (*(int *)(sVar3 + 0xc) != 0xc)) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:45: Obtained value is not equal to 12"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  if (sVar2 != sVar3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:47: Obtained value is not equal to symbol"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  if (sysbvm_test_currentHasError == 0) {
    __format = " Success\n";
  }
  printf(__format);
  return;
}

Assistant:

TEST_SUITE(StringSymbol)
{
    TEST_CASE_WITH_FIXTURE(InternWithString, TuuvmCore)
    {
        sysbvm_tuple_t symbol = sysbvm_symbol_internWithString(sysbvm_test_context, 2, "ABC");
        TEST_ASSERT(sysbvm_tuple_isBytes(symbol));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_getSizeInBytes(symbol));

        sysbvm_tuple_t secondSymbol = sysbvm_symbol_internWithString(sysbvm_test_context, 2, "ABC");
        TEST_ASSERT(sysbvm_tuple_isBytes(secondSymbol));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_getSizeInBytes(secondSymbol));

        TEST_ASSERT_EQUALS(symbol, secondSymbol);
    }

    TEST_CASE_WITH_FIXTURE(InternWithCString, TuuvmCore)
    {
        sysbvm_tuple_t symbol = sysbvm_symbol_internWithCString(sysbvm_test_context, "Hello World\n");
        TEST_ASSERT(sysbvm_tuple_isBytes(symbol));
        TEST_ASSERT_EQUALS(12, sysbvm_tuple_getSizeInBytes(symbol));

        sysbvm_tuple_t secondSymbol = sysbvm_symbol_internWithCString(sysbvm_test_context, "Hello World\n");
        TEST_ASSERT(sysbvm_tuple_isBytes(secondSymbol));
        TEST_ASSERT_EQUALS(12, sysbvm_tuple_getSizeInBytes(secondSymbol));

        TEST_ASSERT_EQUALS(symbol, secondSymbol);
    }
}